

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

void __thiscall clip_model_loader::alloc_compute_meta(clip_model_loader *this)

{
  int iVar1;
  clip_ctx *pcVar2;
  pointer ppgVar3;
  ggml_backend_buffer_type *pgVar4;
  long lVar5;
  long lVar6;
  ggml_cgraph *pgVar7;
  ulong uVar8;
  undefined8 uVar9;
  clip_image_size load_image_size;
  size_t i;
  ulong uVar10;
  undefined1 auVar11 [16];
  clip_image_f32_ptr img;
  clip_image_f32_batch batch;
  
  pcVar2 = this->ctx_clip;
  iVar1 = pcVar2->max_nodes;
  lVar5 = ggml_tensor_overhead();
  lVar6 = ggml_graph_overhead();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pcVar2->buf_compute_meta,iVar1 * lVar5 + lVar6);
  batch.entries.
  super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  batch.entries.
  super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  batch.entries.
  super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  img._M_t.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>._M_t.
  super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
  super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl =
       (__uniq_ptr_data<clip_image_f32,_clip_image_f32_deleter,_true,_true>)clip_image_f32_init();
  iVar1 = (this->ctx_clip->vision_model).hparams.image_size;
  *(int *)img._M_t.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>._M_t.
          super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
          super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl = iVar1;
  *(int *)((long)img._M_t.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>._M_t.
                 super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
                 super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl + 4) = iVar1;
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             ((long)img._M_t.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>._M_t.
                    super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
                    super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl + 8),
             (ulong)(uint)(iVar1 * iVar1 * 3));
  std::
  vector<std::unique_ptr<clip_image_f32,clip_image_f32_deleter>,std::allocator<std::unique_ptr<clip_image_f32,clip_image_f32_deleter>>>
  ::emplace_back<std::unique_ptr<clip_image_f32,clip_image_f32_deleter>>
            ((vector<std::unique_ptr<clip_image_f32,clip_image_f32_deleter>,std::allocator<std::unique_ptr<clip_image_f32,clip_image_f32_deleter>>>
              *)&batch,&img);
  load_image_size.height = iVar1;
  load_image_size.width = iVar1;
  pgVar7 = clip_image_build_graph(this->ctx_clip,&batch,load_image_size,false);
  ggml_backend_sched_reserve
            ((this->ctx_clip->sched)._M_t.
             super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,pgVar7);
  uVar10 = 0;
  while( true ) {
    pcVar2 = this->ctx_clip;
    ppgVar3 = (pcVar2->backend_ptrs).
              super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(pcVar2->backend_ptrs).
                      super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppgVar3 >> 3) <= uVar10) break;
    pgVar4 = (pcVar2->backend_buft).
             super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar10];
    uVar8 = ggml_backend_sched_get_buffer_size
                      ((pcVar2->sched)._M_t.
                       super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                       super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                       super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,
                       ppgVar3[uVar10]);
    if ((1 < uVar8) && ((int)g_logger_state.verbosity_thold < 3)) {
      uVar9 = ggml_backend_buft_name(pgVar4);
      auVar11._8_4_ = (int)(uVar8 >> 0x20);
      auVar11._0_8_ = uVar8;
      auVar11._12_4_ = 0x45300000;
      clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: %10s compute buffer size = %8.2f MiB\n",
                        ((auVar11._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) *
                        0.0009765625 * 0.0009765625,"alloc_compute_meta",uVar9);
    }
    uVar10 = uVar10 + 1;
  }
  std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::~unique_ptr(&img);
  std::
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  ::~vector(&batch.entries);
  return;
}

Assistant:

void alloc_compute_meta() {
        ctx_clip.buf_compute_meta.resize(ctx_clip.max_nodes * ggml_tensor_overhead() + ggml_graph_overhead());

        // create a fake batch
        clip_image_f32_batch batch;
        clip_image_f32_ptr img(clip_image_f32_init());
        clip_image_size image_size;
        image_size.width  = ctx_clip.vision_model.hparams.image_size;
        image_size.height = ctx_clip.vision_model.hparams.image_size;
        img->nx = image_size.width;
        img->ny = image_size.height;
        img->buf.resize(image_size.width * image_size.height * 3);
        batch.entries.push_back(std::move(img));

        ggml_cgraph * gf = clip_image_build_graph(&ctx_clip, batch, image_size, false);
        ggml_backend_sched_reserve(ctx_clip.sched.get(), gf);
        for (size_t i = 0; i < ctx_clip.backend_ptrs.size(); ++i) {
            ggml_backend_t backend = ctx_clip.backend_ptrs[i];
            ggml_backend_buffer_type_t buft = ctx_clip.backend_buft[i];
            size_t size = ggml_backend_sched_get_buffer_size(ctx_clip.sched.get(), backend);
            if (size > 1) {
                LOG_INF("%s: %10s compute buffer size = %8.2f MiB\n", __func__,
                        ggml_backend_buft_name(buft),
                        size / 1024.0 / 1024.0);
            }
        }
    }